

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

int cmsys::regmatch(char *prog)

{
  byte bVar1;
  bool bVar2;
  byte *__s2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  byte bVar8;
  byte *prog_00;
  char *pcVar9;
  int unaff_R12D;
  size_t sVar10;
  byte *__s;
  long lVar11;
  
  if (prog != (char *)0x0) {
    do {
      __s2 = reginput;
      if ((prog == &regdummy) ||
         (uVar4 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8,
         uVar4 == 0)) {
        prog_00 = (byte *)0x0;
      }
      else if (*prog == 7) {
        prog_00 = (byte *)prog + -(ulong)uVar4;
      }
      else {
        prog_00 = (byte *)prog + uVar4;
      }
      bVar1 = *prog;
      if (0x27 < bVar1) {
switchD_00403a83_caseD_c:
        pcVar9 = "RegularExpression::find(): Internal error -- memory corrupted.";
        goto LAB_00403c45;
      }
      lVar11 = (long)(char)bVar1;
      iVar6 = 1;
      switch(bVar1) {
      case 0:
        goto switchD_00403a83_caseD_0;
      case 1:
        if (reginput != regbol) goto LAB_00403c4a;
        break;
      case 2:
        if (*reginput != 0) goto LAB_00403c4a;
        break;
      case 3:
        if (*reginput != 0) goto LAB_00403c07;
        goto LAB_00403c4a;
      case 4:
        if ((char)*reginput == 0) {
          return 0;
        }
        pcVar9 = strchr((char *)((byte *)prog + 3),(int)(char)*reginput);
        if (pcVar9 == (char *)0x0) {
          return 0;
        }
        goto LAB_00403c07;
      case 5:
        if ((char)*reginput == 0) {
          return 0;
        }
        pcVar9 = strchr((char *)((byte *)prog + 3),(int)(char)*reginput);
        if (pcVar9 != (char *)0x0) {
          return 0;
        }
LAB_00403c07:
        reginput = __s2 + 1;
        break;
      case 6:
        bVar1 = *prog_00;
        if (bVar1 == 6) {
          while (reginput = __s2, iVar6 = regmatch((char *)((byte *)prog + 3)), iVar6 == 0) {
            if ((prog == &regdummy) ||
               (uVar4 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8,
               uVar4 == 0)) {
              prog = (char *)0x0;
            }
            else if (*prog == 7) {
              prog = (char *)((byte *)prog + -(ulong)uVar4);
            }
            else {
              prog = (char *)((byte *)prog + uVar4);
            }
            unaff_R12D = 0;
            reginput = __s2;
            if (((byte *)prog == (byte *)0x0) || (*prog != 6)) goto LAB_00403c29;
          }
          unaff_R12D = 1;
        }
        else {
          prog_00 = (byte *)prog + 3;
          reginput = __s2;
        }
LAB_00403c29:
        if (bVar1 == 6) {
          return unaff_R12D;
        }
        break;
      case 7:
      case 9:
        break;
      case 8:
        bVar2 = false;
        iVar6 = 0;
        if (((byte *)prog)[3] == *reginput) {
          sVar7 = strlen((char *)((byte *)prog + 3));
          if (1 < sVar7) {
            iVar5 = strncmp((char *)((byte *)prog + 3),(char *)__s2,sVar7);
            bVar2 = false;
            iVar6 = 0;
            if (iVar5 != 0) goto LAB_00403b78;
          }
          reginput = __s2 + sVar7;
          bVar2 = true;
          iVar6 = unaff_R12D;
        }
LAB_00403b78:
        unaff_R12D = iVar6;
        if (!bVar2) {
          return iVar6;
        }
        break;
      case 10:
      case 0xb:
        bVar8 = 0;
        if (*prog_00 == 8) {
          bVar8 = prog_00[3];
        }
        if (5 < ((byte *)prog)[3] - 3) {
switchD_00403cfe_caseD_6:
          puts("cm RegularExpression::find(): Internal error.");
          iVar6 = 0;
          goto LAB_00403db3;
        }
        __s = (byte *)prog + 6;
        switch((uint)((byte *)prog)[3]) {
        case 3:
          sVar10 = strlen((char *)reginput);
          reginput = __s2 + (int)sVar10;
          goto LAB_00403dac;
        case 4:
          bVar3 = *reginput;
          if (bVar3 != 0) {
            sVar10 = 0;
            goto LAB_00403d62;
          }
          break;
        case 5:
          bVar3 = *reginput;
          if (bVar3 != 0) {
            sVar10 = 0;
            goto LAB_00403d36;
          }
          break;
        default:
          goto switchD_00403cfe_caseD_6;
        case 8:
          if (*__s != *reginput) break;
          sVar7 = 0;
          do {
            sVar10 = sVar7 + 1;
            lVar11 = sVar7 + 1;
            sVar7 = sVar10;
          } while (*__s == reginput[lVar11]);
          reginput = reginput + sVar10;
          goto LAB_00403dac;
        }
        sVar10 = 0;
        goto LAB_00403dac;
      default:
        goto switchD_00403a83_caseD_c;
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
        iVar6 = regmatch((char *)prog_00);
        if (iVar6 != 0) {
          if (*(long *)(regstartp + -0xa0 + lVar11 * 8) != 0) {
            return 1;
          }
          *(byte **)(regstartp + -0xa0 + lVar11 * 8) = __s2;
          return 1;
        }
        goto LAB_00403c4a;
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        iVar6 = regmatch((char *)prog_00);
        if (iVar6 != 0) {
          if (*(long *)(regendp + -0xf0 + lVar11 * 8) != 0) {
            return 1;
          }
          *(byte **)(regendp + -0xf0 + lVar11 * 8) = __s2;
          return 1;
        }
        goto LAB_00403c4a;
      }
      prog = (char *)prog_00;
    } while (prog_00 != (byte *)0x0);
  }
  pcVar9 = "RegularExpression::find(): Internal error -- corrupted pointers.";
LAB_00403c45:
  puts(pcVar9);
  goto LAB_00403c4a;
  while( true ) {
    bVar3 = __s2[sVar10 + 1];
    sVar10 = sVar10 + 1;
    if (bVar3 == 0) break;
LAB_00403d36:
    pcVar9 = strchr((char *)__s,(int)(char)bVar3);
    if (pcVar9 != (char *)0x0) break;
  }
  goto LAB_00403d7e;
  while( true ) {
    bVar3 = __s2[sVar10 + 1];
    sVar10 = sVar10 + 1;
    if (bVar3 == 0) break;
LAB_00403d62:
    pcVar9 = strchr((char *)__s,(int)(char)bVar3);
    if (pcVar9 == (char *)0x0) break;
  }
LAB_00403d7e:
  reginput = __s2 + sVar10;
LAB_00403dac:
  iVar6 = (int)sVar10;
LAB_00403db3:
  if ((int)(uint)(bVar1 != 10) <= iVar6) {
    lVar11 = (long)iVar6 + 1;
    do {
      if (((bVar8 == 0) || (bVar8 == *reginput)) && (iVar6 = regmatch((char *)prog_00), iVar6 != 0))
      {
        return 1;
      }
      reginput = __s2 + lVar11 + -2;
      lVar11 = lVar11 + -1;
    } while ((long)(ulong)(bVar1 != 10) < lVar11);
  }
LAB_00403c4a:
  iVar6 = 0;
switchD_00403a83_caseD_0:
  return iVar6;
}

Assistant:

static int regmatch (const char* prog) {
    const char* scan;  // Current node.
    const char* next;  // Next node.

    scan = prog;

    while (scan != 0) {

        next = regnext(scan);

        switch (OP(scan)) {
            case BOL:
                if (reginput != regbol)
                    return (0);
                break;
            case EOL:
                if (*reginput != '\0')
                    return (0);
                break;
            case ANY:
                if (*reginput == '\0')
                    return (0);
                reginput++;
                break;
            case EXACTLY:{
                    size_t len;
                    const char* opnd;

                    opnd = OPERAND(scan);
                    // Inline the first character, for speed.
                    if (*opnd != *reginput)
                        return (0);
                    len = strlen(opnd);
                    if (len > 1 && strncmp(opnd, reginput, len) != 0)
                        return (0);
                    reginput += len;
                }
                break;
            case ANYOF:
                if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) == 0)
                    return (0);
                reginput++;
                break;
            case ANYBUT:
                if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) != 0)
                    return (0);
                reginput++;
                break;
            case NOTHING:
                break;
            case BACK:
                break;
            case OPEN + 1:
            case OPEN + 2:
            case OPEN + 3:
            case OPEN + 4:
            case OPEN + 5:
            case OPEN + 6:
            case OPEN + 7:
            case OPEN + 8:
            case OPEN + 9:{
                    int    no;
                    const char* save;

                    no = OP(scan) - OPEN;
                    save = reginput;

                    if (regmatch(next)) {

                        //
                        // Don't set startp if some later invocation of the
                        // same parentheses already has.
                        //
                        if (regstartp[no] == 0)
                            regstartp[no] = save;
                        return (1);
                    }
                    else
                        return (0);
                }
//              break;
            case CLOSE + 1:
            case CLOSE + 2:
            case CLOSE + 3:
            case CLOSE + 4:
            case CLOSE + 5:
            case CLOSE + 6:
            case CLOSE + 7:
            case CLOSE + 8:
            case CLOSE + 9:{
                    int    no;
                    const char* save;

                    no = OP(scan) - CLOSE;
                    save = reginput;

                    if (regmatch(next)) {

                        //
                        // Don't set endp if some later invocation of the
                        // same parentheses already has.
                        //
                        if (regendp[no] == 0)
                            regendp[no] = save;
                        return (1);
                    }
                    else
                        return (0);
                }
//              break;
            case BRANCH:{

              const char* save;

                    if (OP(next) != BRANCH)     // No choice.
                        next = OPERAND(scan);   // Avoid recursion.
                    else {
                        do {
                            save = reginput;
                            if (regmatch(OPERAND(scan)))
                                return (1);
                            reginput = save;
                            scan = regnext(scan);
                        } while (scan != 0 && OP(scan) == BRANCH);
                        return (0);
                        // NOTREACHED
                    }
                }
                break;
            case STAR:
            case PLUS:{
                    char   nextch;
                    int        no;
                    const char* save;
                    int        min_no;

                    //
                    // Lookahead to avoid useless match attempts when we know
                    // what character comes next.
                    //
                    nextch = '\0';
                    if (OP(next) == EXACTLY)
                        nextch = *OPERAND(next);
                    min_no = (OP(scan) == STAR) ? 0 : 1;
                    save = reginput;
                    no = regrepeat(OPERAND(scan));
                    while (no >= min_no) {
                        // If it could work, try it.
                        if (nextch == '\0' || *reginput == nextch)
                            if (regmatch(next))
                                return (1);
                        // Couldn't or didn't -- back up.
                        no--;
                        reginput = save + no;
                    }
                    return (0);
                }
//              break;
            case END:
                return (1);     // Success!

            default:
                //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
                printf ("RegularExpression::find(): Internal error -- memory corrupted.\n");
                return 0;
        }
        scan = next;
    }

    //
    //  We get here only if there's trouble -- normally "case END" is the
    //  terminating point.
    //
    //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
    printf ("RegularExpression::find(): Internal error -- corrupted pointers.\n");
    return (0);
}